

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O1

bool __thiscall ftxui::Component::Focused(Component *this)

{
  Component *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  byte unaff_BL;
  bool bVar3;
  
  do {
    pCVar1 = this->parent_;
    if (pCVar1 == (Component *)0x0) {
      unaff_BL = true;
      bVar3 = false;
    }
    else {
      iVar2 = (*pCVar1->_vptr_Component[4])(pCVar1);
      bVar3 = (Component *)CONCAT44(extraout_var,iVar2) == this;
      if (!bVar3) {
        pCVar1 = this;
      }
      this = pCVar1;
      unaff_BL = unaff_BL & bVar3;
    }
  } while (bVar3);
  return (bool)unaff_BL;
}

Assistant:

bool Component::Focused() {
  Component* current = this;
  for (;;) {
    Component* parent = current->parent_;
    if (!parent)
      return true;
    if (parent->ActiveChild() != current)
      return false;
    current = parent;
  }
}